

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugMacro.cpp
# Opt level: O2

void __thiscall llvm::DWARFDebugMacro::parse(DWARFDebugMacro *this,DataExtractor data)

{
  reference pEVar1;
  uint64_t uVar2;
  char *pcVar3;
  SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *this_00;
  uint64_t local_40;
  uint64_t Offset;
  
  local_40 = 0;
  this_00 = (SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)0x0;
  Offset = (uint64_t)this;
  do {
    uVar2 = Offset;
    if (data.Data.Length <= local_40) {
      return;
    }
    if (this_00 == (SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)0x0) {
      std::
      vector<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>,_std::allocator<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_>_>
      ::emplace_back<>((vector<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>,_std::allocator<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_>_>
                        *)Offset);
      this_00 = (SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)
                (*(long *)(uVar2 + 8) + -0x70);
    }
    SmallVectorImpl<llvm::DWARFDebugMacro::Entry>::emplace_back<>
              ((SmallVectorImpl<llvm::DWARFDebugMacro::Entry> *)this_00);
    pEVar1 = SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>::back(this_00);
    uVar2 = DataExtractor::getULEB128(&data,&local_40,(Error *)0x0);
    pEVar1->Type = (uint32_t)uVar2;
    switch(uVar2 & 0xffffffff) {
    case 0:
    case 4:
      goto switchD_00d9349b_caseD_0;
    case 3:
      uVar2 = DataExtractor::getULEB128(&data,&local_40,(Error *)0x0);
      (pEVar1->field_1).Line = uVar2;
      pcVar3 = (char *)DataExtractor::getULEB128(&data,&local_40,(Error *)0x0);
      break;
    default:
      if ((uint32_t)uVar2 != 0xff) {
        pEVar1->Type = 0xffffffff;
        return;
      }
    case 1:
    case 2:
      uVar2 = DataExtractor::getULEB128(&data,&local_40,(Error *)0x0);
      (pEVar1->field_1).Line = uVar2;
      pcVar3 = DataExtractor::getCStr(&data,&local_40);
    }
    (pEVar1->field_2).MacroStr = pcVar3;
switchD_00d9349b_caseD_0:
  } while( true );
}

Assistant:

void DWARFDebugMacro::parse(DataExtractor data) {
  uint64_t Offset = 0;
  MacroList *M = nullptr;
  while (data.isValidOffset(Offset)) {
    if (!M) {
      MacroLists.emplace_back();
      M = &MacroLists.back();
    }
    // A macro list entry consists of:
    M->emplace_back();
    Entry &E = M->back();
    // 1. Macinfo type
    E.Type = data.getULEB128(&Offset);

    if (E.Type == 0) {
      // Reached end of a ".debug_macinfo" section contribution.
      continue;
    }

    switch (E.Type) {
    default:
      // Got a corrupted ".debug_macinfo" section (invalid macinfo type).
      // Push the corrupted entry to the list and halt parsing.
      E.Type = DW_MACINFO_invalid;
      return;
    case DW_MACINFO_define:
    case DW_MACINFO_undef:
      // 2. Source line
      E.Line = data.getULEB128(&Offset);
      // 3. Macro string
      E.MacroStr = data.getCStr(&Offset);
      break;
    case DW_MACINFO_start_file:
      // 2. Source line
      E.Line = data.getULEB128(&Offset);
      // 3. Source file id
      E.File = data.getULEB128(&Offset);
      break;
    case DW_MACINFO_end_file:
      break;
    case DW_MACINFO_vendor_ext:
      // 2. Vendor extension constant
      E.ExtConstant = data.getULEB128(&Offset);
      // 3. Vendor extension string
      E.ExtStr = data.getCStr(&Offset);
      break;
    }
  }
}